

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::GLMClassifier::_InternalSerialize
          (GLMClassifier *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  GLMClassifier *pGVar2;
  uint uVar3;
  uint8_t *puVar4;
  Type *value;
  LogMessage *other;
  uint32_t uVar5;
  ulong uVar6;
  int index;
  uint size;
  LogFinisher local_71;
  GLMClassifier *local_70;
  LogMessage local_68;
  
  iVar1 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  local_70 = this;
  for (index = 0; pGVar2 = local_70, iVar1 != index; index = index + 1) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                      (&(this->weights_).super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::GLMClassifier_DoubleArray>
                       (1,value,puVar4,stream);
  }
  if (0 < (local_70->offset_).current_size_) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar1 = (pGVar2->offset_).current_size_;
    if (stream->end_ <= puVar4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_71,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *puVar4 = '\x12';
    puVar4 = puVar4 + 2;
    size = iVar1 << 3;
    for (uVar3 = size; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      puVar4[-1] = (byte)uVar3 | 0x80;
      puVar4 = puVar4 + 1;
    }
    puVar4[-1] = (byte)uVar3;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,(pGVar2->offset_).arena_or_elements_,size,puVar4);
  }
  if (pGVar2->postevaluationtransform_ != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (3,pGVar2->postevaluationtransform_,puVar4);
  }
  if (pGVar2->classencoding_ != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (4,pGVar2->classencoding_,puVar4);
  }
  uVar5 = pGVar2->_oneof_case_[0];
  if (uVar5 == 100) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::StringVector>
                       (100,(pGVar2->ClassLabels_).stringclasslabels_,puVar4,stream);
    uVar5 = pGVar2->_oneof_case_[0];
  }
  if (uVar5 == 0x65) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Int64Vector>
                       (0x65,(pGVar2->ClassLabels_).int64classlabels_,puVar4,stream);
  }
  uVar6 = (pGVar2->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar6 + 8),*(int *)(uVar6 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* GLMClassifier::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GLMClassifier)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_weights_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_weights(i), target, stream);
  }

  // repeated double offset = 2;
  if (this->_internal_offset_size() > 0) {
    target = stream->WriteFixedPacked(2, _internal_offset(), target);
  }

  // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->_internal_postevaluationtransform() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_postevaluationtransform(), target);
  }

  // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
  if (this->_internal_classencoding() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_classencoding(), target);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (_internal_has_stringclasslabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        100, _Internal::stringclasslabels(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (_internal_has_int64classlabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        101, _Internal::int64classlabels(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GLMClassifier)
  return target;
}